

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURLcode upkeep(conncache *conn_cache,void *data)

{
  void *data_local;
  conncache *conn_cache_local;
  
  Curl_conncache_foreach((Curl_easy *)data,conn_cache,data,conn_upkeep);
  return CURLE_OK;
}

Assistant:

static CURLcode upkeep(struct conncache *conn_cache, void *data)
{
  /* Loop over every connection and make connection alive. */
  Curl_conncache_foreach(data,
                         conn_cache,
                         data,
                         conn_upkeep);
  return CURLE_OK;
}